

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_status_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::provider::ProviderStatusTest_test_ostream_Test::TestBody
          (ProviderStatusTest_test_ostream_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_3f8;
  Message local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_5;
  string local_3b0 [32];
  AssertHelper local_390;
  Message local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_4;
  string local_348 [32];
  AssertHelper local_328;
  Message local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_3;
  string local_2e0 [32];
  AssertHelper local_2c0;
  Message local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_2;
  string local_278 [32];
  AssertHelper local_258;
  Message local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  string local_210 [32];
  AssertHelper local_1f0;
  Message local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  Status local_19c;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  ProviderStatusTest_test_ostream_Test *local_10;
  ProviderStatusTest_test_ostream_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = READY;
  price::provider::operator<<(local_188,&local_19c);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"\"READY\"","ss.str()",(char (*) [6])"READY",&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::string::string(local_210);
  std::__cxx11::stringstream::str((string *)local_198);
  std::__cxx11::string::~string(local_210);
  gtest_ar_1.message_.ptr_._4_4_ = 2;
  price::provider::operator<<(local_188,(Status *)((long)&gtest_ar_1.message_.ptr_ + 4));
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_228,"\"DOWN\"","ss.str()",(char (*) [5])"DOWN",&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::__cxx11::string::string(local_278);
  std::__cxx11::stringstream::str((string *)local_198);
  std::__cxx11::string::~string(local_278);
  gtest_ar_2.message_.ptr_._4_4_ = 5;
  price::provider::operator<<(local_188,(Status *)((long)&gtest_ar_2.message_.ptr_ + 4));
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_290,"\"CLOSED\"","ss.str()",(char (*) [7])"CLOSED",&local_2b0)
  ;
  std::__cxx11::string::~string((string *)&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  std::__cxx11::string::string(local_2e0);
  std::__cxx11::stringstream::str((string *)local_198);
  std::__cxx11::string::~string(local_2e0);
  gtest_ar_3.message_.ptr_._4_4_ = 3;
  price::provider::operator<<(local_188,(Status *)((long)&gtest_ar_3.message_.ptr_ + 4));
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((EqHelper<false> *)local_2f8,"\"UNAVAILABLE\"","ss.str()",(char (*) [12])"UNAVAILABLE",
             &local_318);
  std::__cxx11::string::~string((string *)&local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::__cxx11::string::string(local_348);
  std::__cxx11::stringstream::str((string *)local_198);
  std::__cxx11::string::~string(local_348);
  gtest_ar_4.message_.ptr_._4_4_ = 1;
  price::provider::operator<<(local_188,(Status *)((long)&gtest_ar_4.message_.ptr_ + 4));
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_360,"\"DISABLED\"","ss.str()",(char (*) [9])"DISABLED",
             &local_380);
  std::__cxx11::string::~string((string *)&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  std::__cxx11::string::string(local_3b0);
  std::__cxx11::stringstream::str((string *)local_198);
  std::__cxx11::string::~string(local_3b0);
  gtest_ar_5.message_.ptr_._4_4_ = 4;
  price::provider::operator<<(local_188,(Status *)((long)&gtest_ar_5.message_.ptr_ + 4));
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_3c8,"\"INVALID\"","ss.str()",(char (*) [8])"INVALID",
             &local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

TEST(ProviderStatusTest, test_ostream)
{
    std::stringstream ss;
    ss << Provider::Status::READY;
    EXPECT_EQ("READY", ss.str());

    ss.str(std::string());
    ss << Provider::Status::DOWN;
    EXPECT_EQ("DOWN", ss.str());

    ss.str(std::string());
    ss << Provider::Status::CLOSED;
    EXPECT_EQ("CLOSED", ss.str());

    ss.str(std::string());
    ss << Provider::Status::UNAVAILABLE;
    EXPECT_EQ("UNAVAILABLE", ss.str());

    ss.str(std::string());
    ss << Provider::Status::DISABLED;
    EXPECT_EQ("DISABLED", ss.str());

    ss.str(std::string());
    ss << Provider::Status::INVALID;
    EXPECT_EQ("INVALID", ss.str());
}